

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildInfo.cpp
# Opt level: O0

ProtocolVersion * jbcoin::BuildInfo::getMinimumProtocol(void)

{
  return &getMinimumProtocol::minimumProtocol;
}

Assistant:

ProtocolVersion const&
getMinimumProtocol ()
{
    static ProtocolVersion minimumProtocol (

    //--------------------------------------------------------------------------
    //
    // The oldest protocol version we will accept. (edit this if necessary)
    //
        1,  // major
        2   // minor
    //
    //--------------------------------------------------------------------------
    );

    return minimumProtocol;
}